

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

ScalarFunction * duckdb::ListDistinctFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  allocator_type *in_stack_fffffffffffffe98;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffea0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  LogicalType *local_100;
  LogicalType local_e0 [24];
  undefined1 local_c8 [32];
  LogicalType local_a8 [24];
  LogicalType local_90 [27];
  undefined1 local_75;
  LogicalType local_68 [24];
  LogicalType *local_50;
  LogicalType local_48 [24];
  LogicalType *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_75 = 1;
  local_50 = local_48;
  duckdb::LogicalType::LogicalType(local_68,ANY);
  duckdb::LogicalType::LIST(local_48);
  local_75 = 0;
  local_30 = local_48;
  local_28 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xd506c8);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffeb0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffea8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffeb4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffea0,iVar1,in_stack_fffffffffffffe98);
  duckdb::LogicalType::LogicalType(local_a8,ANY);
  duckdb::LogicalType::LIST(local_90);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
            );
  duckdb::LogicalType::LogicalType(local_e0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_20,local_90,local_c8,ListDistinctBind,0,0,ListAggregatesInitLocalState,
             local_e0,0,0,0);
  duckdb::LogicalType::~LogicalType(local_e0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd507bd);
  duckdb::LogicalType::~LogicalType(local_90);
  duckdb::LogicalType::~LogicalType(local_a8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd507e4);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xd507f1);
  local_100 = (LogicalType *)&local_30;
  do {
    local_100 = local_100 + -0x18;
    duckdb::LogicalType::~LogicalType(local_100);
  } while (local_100 != local_48);
  duckdb::LogicalType::~LogicalType(local_68);
  return in_RDI;
}

Assistant:

ScalarFunction ListDistinctFun::GetFunction() {
	return ScalarFunction({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY),
	                      ListDistinctFunction, ListDistinctBind, nullptr, nullptr, ListAggregatesInitLocalState);
}